

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O2

bool __thiscall HEkkDual::checkNonUnitWeightError(HEkkDual *this,string *message)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  uVar2 = 0;
  if (this->edge_weight_mode == kDantzig) {
    uVar1 = (ulong)(uint)this->solver_num_row;
    if (this->solver_num_row < 1) {
      uVar1 = uVar2;
    }
    dVar3 = 0.0;
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      dVar3 = dVar3 + ABS((this->ekk_instance_->dual_edge_weight_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar2] + -1.0);
    }
    if (dVar3 <= 0.0001) {
      uVar2 = 0;
    }
    else {
      uVar2 = 1;
      printf("Non-unit Edge weight error of %g: %s\n",(message->_M_dataplus)._M_p);
    }
  }
  return SUB81(uVar2,0);
}

Assistant:

bool HEkkDual::checkNonUnitWeightError(std::string message) {
  bool error_found = false;
  if (edge_weight_mode == EdgeWeightMode::kDantzig) {
    std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
    double unit_wt_error = 0;
    for (HighsInt iRow = 0; iRow < solver_num_row; iRow++) {
      unit_wt_error += fabs(edge_weight[iRow] - 1.0);
    }
    error_found = unit_wt_error > 1e-4;
    if (error_found)
      printf("Non-unit Edge weight error of %g: %s\n", unit_wt_error,
             message.c_str());
  }
  return error_found;
}